

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgLinearSolvers.cpp
# Opt level: O0

void TasGrid::Utils::transpose<float>(longlong M,longlong N,float *A,float *B)

{
  longlong M_00;
  longlong *plVar1;
  float *local_68;
  long local_60;
  long local_58;
  longlong j;
  longlong i;
  longlong t;
  longlong bN;
  longlong bM;
  longlong bsize;
  float *B_local;
  float *A_local;
  longlong N_local;
  longlong M_local;
  
  bM = 0x40;
  bN = M / 0x40 + (long)(int)(uint)(M % 0x40 != 0);
  t = N / 0x40 + (long)(int)(uint)(N % 0x40 != 0);
  bsize = (longlong)B;
  B_local = A;
  A_local = (float *)N;
  N_local = M;
  for (i = 0; i < bN * t; i = i + 1) {
    j = i / t;
    local_58 = i % t;
    local_60 = N_local + j * -0x40;
    plVar1 = ::std::min<long_long>(&bM,&local_60);
    M_00 = *plVar1;
    local_68 = A_local + local_58 * -0x10;
    plVar1 = ::std::min<long_long>(&bM,(longlong *)&local_68);
    copy_transpose<float>
              (M_00,*plVar1,B_local + j * 0x40 + local_58 * 0x40 * N_local,N_local,
               (float *)(bsize + j * 0x40 * (long)A_local * 4 + local_58 * 0x100),(longlong)A_local)
    ;
  }
  return;
}

Assistant:

void transpose(long long M, long long N, scalar_type const A[], scalar_type B[]){
    constexpr long long bsize = 64;
    long long bM = (M / bsize) + ((M % bsize == 0) ? 0 : 1); // number of blocks in M and N
    long long bN = (N / bsize) + ((N % bsize == 0) ? 0 : 1);
    #pragma omp parallel for
    for(long long t =0; t < bM * bN; t++){
        long long i = t / bN;
        long long j = t % bN;
        copy_transpose(std::min(bsize, M - i * bsize), std::min(bsize, N - j * bsize),
                        A + i * bsize + j * bsize * M, M,
                        B + i * bsize * N + j * bsize, N);
    }
}